

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O2

String * __thiscall
capnp::_::enumString(String *__return_storage_ptr__,_ *this,uint16_t value,RawBrandedSchema *schema)

{
  undefined6 in_register_00000012;
  unsigned_short *params;
  Reader RVar1;
  StringPtr value_00;
  EnumerantList enumerants;
  undefined2 local_ca;
  Reader local_c8;
  EnumerantList local_90;
  Enumerant local_58;
  
  local_c8._reader.segment = (SegmentReader *)CONCAT62(in_register_00000012,value);
  local_ca = SUB82(this,0);
  local_58.parent = Schema::asEnum((Schema *)&local_c8);
  EnumSchema::getEnumerants(&local_90,&local_58.parent);
  if ((uint)this < local_90.list.reader.elementCount) {
    EnumSchema::EnumerantList::operator[](&local_58,&local_90,(uint)this);
    local_c8._reader.dataSize = local_58.proto._reader.dataSize;
    local_c8._reader.pointerCount = local_58.proto._reader.pointerCount;
    local_c8._reader._38_2_ = local_58.proto._reader._38_2_;
    local_c8._reader.nestingLimit = local_58.proto._reader.nestingLimit;
    local_c8._reader._44_4_ = local_58.proto._reader._44_4_;
    local_c8._reader.data = local_58.proto._reader.data;
    local_c8._reader.pointers = local_58.proto._reader.pointers;
    local_c8._reader.segment = local_58.proto._reader.segment;
    local_c8._reader.capTable = local_58.proto._reader.capTable;
    RVar1 = capnp::schema::Enumerant::Reader::getName(&local_c8);
    value_00.content.ptr = RVar1.super_StringPtr.content.size_;
    value_00.content.size_ = (size_t)schema;
    kj::heapString(__return_storage_ptr__,RVar1.super_StringPtr.content.ptr,value_00);
  }
  else {
    kj::str<unsigned_short&>(__return_storage_ptr__,(kj *)&local_ca,params);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String enumString(uint16_t value, const RawBrandedSchema& schema) {
  auto enumerants = Schema(&schema).asEnum().getEnumerants();
  if (value < enumerants.size()) {
    return kj::heapString(enumerants[value].getProto().getName());
  } else {
    return kj::str(value);
  }
}